

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

uint __thiscall CScript::GetSigOpCount(CScript *this,bool fAccurate)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  const_iterator x;
  undefined1 in_SIL;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  opcodetype lastOpcode;
  uint n;
  opcodetype opcode;
  const_iterator pc;
  opcodetype in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  undefined3 in_stack_ffffffffffffffdc;
  uint uVar6;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = CONCAT13(in_SIL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  uVar5 = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_RDI);
  iVar2 = 0xff;
  while( true ) {
    iVar4 = iVar2;
    x = prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_RDI);
    bVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                      ((const_iterator *)in_RDI,x);
    if ((!bVar3) ||
       (bVar3 = GetOp((CScript *)CONCAT44(uVar6,uVar5),
                      (const_iterator *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                      (opcodetype *)x.ptr), !bVar3)) break;
    iVar2 = local_14;
    if ((local_14 == 0xac) || (local_14 == 0xad)) {
      uVar5 = uVar5 + 1;
    }
    else if ((local_14 == 0xae) || (local_14 == 0xaf)) {
      if (((uVar6 & 0x1000000) == 0) || ((iVar4 < 0x51 || (0x60 < iVar4)))) {
        uVar5 = uVar5 + 0x14;
      }
      else {
        iVar4 = DecodeOP_N(in_stack_ffffffffffffffb8);
        uVar5 = iVar4 + uVar5;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar5;
}

Assistant:

unsigned int CScript::GetSigOpCount(bool fAccurate) const
{
    unsigned int n = 0;
    const_iterator pc = begin();
    opcodetype lastOpcode = OP_INVALIDOPCODE;
    while (pc < end())
    {
        opcodetype opcode;
        if (!GetOp(pc, opcode))
            break;
        if (opcode == OP_CHECKSIG || opcode == OP_CHECKSIGVERIFY)
            n++;
        else if (opcode == OP_CHECKMULTISIG || opcode == OP_CHECKMULTISIGVERIFY)
        {
            if (fAccurate && lastOpcode >= OP_1 && lastOpcode <= OP_16)
                n += DecodeOP_N(lastOpcode);
            else
                n += MAX_PUBKEYS_PER_MULTISIG;
        }
        lastOpcode = opcode;
    }
    return n;
}